

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinExport::WriteBinaryLight(AssbinExport *this,IOStream *container,aiLight *l)

{
  aiLightSourceType local_44;
  AssbinChunkWriter chunk;
  
  chunk.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_00758758;
  chunk.buffer = (uint8_t *)0x0;
  chunk.magic = 0x1235;
  chunk.cur_size = 0;
  chunk.cursor = 0;
  chunk.initial = 0x1000;
  chunk.container = container;
  Write<aiString>(&chunk.super_IOStream,&l->mName);
  local_44 = l->mType;
  Write<unsigned_int>(&chunk.super_IOStream,&local_44);
  if (l->mType != aiLightSource_DIRECTIONAL) {
    (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&l->mAttenuationConstant,4,1);
    (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&l->mAttenuationLinear,4,1);
    (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&l->mAttenuationQuadratic,4,1);
  }
  Write<aiColor3D>(&chunk.super_IOStream,&l->mColorDiffuse);
  Write<aiColor3D>(&chunk.super_IOStream,&l->mColorSpecular);
  Write<aiColor3D>(&chunk.super_IOStream,&l->mColorAmbient);
  if (l->mType == aiLightSource_SPOT) {
    (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&l->mAngleInnerCone,4,1);
    (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&l->mAngleOuterCone,4,1);
  }
  AssbinChunkWriter::~AssbinChunkWriter(&chunk);
  return;
}

Assistant:

void WriteBinaryLight( IOStream * container, const aiLight* l )
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AILIGHT );

        Write<aiString>(&chunk,l->mName);
        Write<unsigned int>(&chunk,l->mType);

        if (l->mType != aiLightSource_DIRECTIONAL) {
            Write<float>(&chunk,l->mAttenuationConstant);
            Write<float>(&chunk,l->mAttenuationLinear);
            Write<float>(&chunk,l->mAttenuationQuadratic);
        }

        Write<aiColor3D>(&chunk,l->mColorDiffuse);
        Write<aiColor3D>(&chunk,l->mColorSpecular);
        Write<aiColor3D>(&chunk,l->mColorAmbient);

        if (l->mType == aiLightSource_SPOT) {
            Write<float>(&chunk,l->mAngleInnerCone);
            Write<float>(&chunk,l->mAngleOuterCone);
        }

    }